

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operators.h
# Opt level: O0

string * __thiscall calc4::BinaryOperator::ToString_abi_cxx11_(BinaryOperator *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"BinaryOperator [Type = ");
  poVar1 = std::operator<<(poVar1,ToString::BinaryTypeTable[*(int *)(in_RSI + 0x38)]);
  std::operator<<(poVar1,"]");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

virtual std::string ToString() const override
    {
        static const char* BinaryTypeTable[] = { "Add",
                                                 "Sub",
                                                 "Mult",
                                                 "Div",
                                                 "Mod",
                                                 "Equal",
                                                 "NotEqual",
                                                 "LessThan",
                                                 "LessThanOrEqual",
                                                 "GreaterThanOrEqual",
                                                 "GreaterThan" };
        std::ostringstream oss;
        oss << "BinaryOperator [Type = " << BinaryTypeTable[(size_t)type] << "]";
        return oss.str();
    }